

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

void VP8LEncoderDelete(VP8LEncoder *enc)

{
  long lVar1;
  
  if (enc != (VP8LEncoder *)0x0) {
    VP8LHashChainClear(&enc->hash_chain);
    lVar1 = 0x868;
    do {
      VP8LBackwardRefsClear((VP8LBackwardRefs *)((long)enc->palette + lVar1 + -0x68));
      lVar1 = lVar1 + 0x28;
    } while (lVar1 != 0x908);
    WebPSafeFree(enc->transform_mem);
    enc->transform_mem = (uint32_t *)0x0;
    enc->transform_mem_size = 0;
    WebPSafeFree(enc);
    return;
  }
  return;
}

Assistant:

static void VP8LEncoderDelete(VP8LEncoder* enc) {
  if (enc != NULL) {
    int i;
    VP8LHashChainClear(&enc->hash_chain);
    for (i = 0; i < 4; ++i) VP8LBackwardRefsClear(&enc->refs[i]);
    ClearTransformBuffer(enc);
    WebPSafeFree(enc);
  }
}